

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void Lib::List<Inferences::ALASCA::FourierMotzkinConf::Lhs>::destroy
               (List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *l)

{
  bool bVar1;
  List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *l_00;
  List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *in_RDI;
  List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *next;
  List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *current;
  size_t in_stack_ffffffffffffffd8;
  
  bVar1 = isEmpty(in_RDI);
  while (!bVar1) {
    l_00 = tail(in_RDI);
    if (in_RDI != (List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *)0x0) {
      ~List((List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *)0x3e06ee);
      operator_delete(in_RDI,in_stack_ffffffffffffffd8);
    }
    bVar1 = isEmpty(l_00);
    in_RDI = l_00;
  }
  return;
}

Assistant:

static void destroy (List *l)
  {
    if (isEmpty(l)) return;
    List* current = l;

    for (;;) {
      List* next = current->tail();
      delete current;
      if (isEmpty(next)) return;
      current = next;
    }
  }